

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

float gl4cts::CopyImage::expandFloat(uint compressed,uint numMantissaBits)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  fVar6 = exp2f((float)numMantissaBits);
  uVar5 = (ulong)fVar6;
  uVar1 = (ulong)compressed % (uVar5 & 0xffffffff);
  iVar3 = (int)uVar1;
  uVar4 = (uint)uVar5;
  fVar6 = 0.0;
  if (uVar4 <= compressed || iVar3 != 0) {
    if (iVar3 == 0 || uVar4 <= compressed) {
      uVar2 = (uint)((ulong)compressed / (uVar5 & 0xffffffff));
      if (uVar2 < 0x1f && uVar4 <= compressed) {
        fVar6 = exp2f((float)(int)uVar2 + -15.0);
        fVar6 = ((float)uVar1 / (float)(uVar5 & 0xffffffff) + 1.0) * fVar6;
      }
      else if (uVar2 == 0x1f && iVar3 == 0) {
        fVar6 = INFINITY;
      }
      else if (iVar3 != 0 && uVar2 == 0x1f) {
        fVar6 = NAN;
      }
    }
    else {
      exp2f(-14.0);
      fVar6 = ((float)uVar1 / (float)(uVar5 & 0xffffffff)) * 6.1035156e-05;
    }
  }
  return fVar6;
}

Assistant:

float expandFloat(const unsigned int compressed, const unsigned int numMantissaBits)
{
	unsigned int divisor = (unsigned int)deFloatPow(2, (float)numMantissaBits);
	float		 retval  = 0.0;
	unsigned int exponent, mantissa;

	exponent = compressed / divisor;
	mantissa = compressed % divisor;
	if (exponent == 0 && mantissa == 0)
		retval = 0.0;
	else if (exponent == 0 && mantissa != 0)
		retval = deFloatPow(2.f, -14.f) * ((float)mantissa / (float)divisor);
	else if (0 < exponent && exponent < 31)
		retval = deFloatPow(2.f, (float)exponent - 15.f) * (1.f + (float)mantissa / (float)divisor);
	else if (exponent == 31 && mantissa == 0)
		retval = INFINITY;
	else if (exponent == 31 && mantissa != 0)
		retval = NAN;
	else
		DE_ASSERT(DE_FALSE && "Invalid exponent and mantissa");

	return retval;
}